

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr valuePop(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  xmlXPathObjectPtr pxVar2;
  long lVar3;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    iVar1 = ctxt->valueNr;
    lVar3 = (long)iVar1;
    if (0 < lVar3) {
      if (ctxt->valueFrame < iVar1) {
        ctxt->valueNr = iVar1 + -1;
        if (iVar1 == 1) {
          pxVar2 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar2 = ctxt->valueTab[lVar3 + -2];
        }
        ctxt->value = pxVar2;
        pxVar2 = ctxt->valueTab[lVar3 + -1];
        ctxt->valueTab[lVar3 + -1] = (xmlXPathObjectPtr)0x0;
        return pxVar2;
      }
      xmlXPathErr(ctxt,0x17);
      return (xmlXPathObjectPtr)0x0;
    }
  }
  return (xmlXPathObjectPtr)0x0;
}

Assistant:

xmlXPathObjectPtr
valuePop(xmlXPathParserContextPtr ctxt)
{
    xmlXPathObjectPtr ret;

    if ((ctxt == NULL) || (ctxt->valueNr <= 0))
        return (NULL);

    if (ctxt->valueNr <= ctxt->valueFrame) {
        xmlXPatherror(ctxt, __FILE__, __LINE__, XPATH_STACK_ERROR);
        return (NULL);
    }

    ctxt->valueNr--;
    if (ctxt->valueNr > 0)
        ctxt->value = ctxt->valueTab[ctxt->valueNr - 1];
    else
        ctxt->value = NULL;
    ret = ctxt->valueTab[ctxt->valueNr];
    ctxt->valueTab[ctxt->valueNr] = NULL;
    return (ret);
}